

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O2

int __thiscall pzshape::TPZShapePiram::ClassId(TPZShapePiram *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"TPZShapePiram",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = pztopology::TPZPyramid::ClassId(&this->super_TPZPyramid);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZShapePiram::ClassId() const{
        return Hash("TPZShapePiram") ^ pztopology::TPZPyramid::ClassId() << 1;
    }